

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O0

void async_connect_handler_fail(error_code *e)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this;
  error_code *in_RDI;
  ostringstream oss;
  string local_1b0 [48];
  ostringstream local_180 [376];
  error_code *local_8;
  
  local_8 = in_RDI;
  booster::aio::io_service::stop();
  bVar1 = std::error_code::operator_cast_to_bool(local_8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_180);
    poVar2 = std::operator<<((ostream *)local_180,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x159);
    std::operator<<(poVar2," e");
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(this,local_1b0);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void async_connect_handler_fail(booster::system::error_code const &e)
{
    the_service->stop();
    TEST(e);
}